

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint32_t FastPForLib::bits(uint32_t v)

{
  uint32_t r;
  uint32_t v_local;
  
  r = 0;
  v_local = v;
  if (0x7fff < v) {
    v_local = v >> 0x10;
    r = 0x10;
  }
  if (0x7f < v_local) {
    v_local = v_local >> 8;
    r = r + 8;
  }
  if (7 < v_local) {
    v_local = v_local >> 4;
    r = r + 4;
  }
  if (1 < v_local) {
    v_local = v_local >> 2;
    r = r + 2;
  }
  if (v_local != 0) {
    r = r + 1;
  }
  return r;
}

Assistant:

__attribute__((const)) inline uint32_t bits(uint32_t v) {
  uint32_t r(0);
  if (v >= (1U << 15)) {
    v >>= 16;
    r += 16;
  }
  if (v >= (1U << 7)) {
    v >>= 8;
    r += 8;
  }
  if (v >= (1U << 3)) {
    v >>= 4;
    r += 4;
  }
  if (v >= (1U << 1)) {
    v >>= 2;
    r += 2;
  }
  if (v >= 1U) {
    r += 1;
  }
  return r;
}